

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall CConnman::MaybePickPreferredNetwork(CConnman *this,optional<Network> *network)

{
  Network net;
  bool bVar1;
  size_t sVar2;
  _Optional_payload_base<Network> net_00;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock75;
  array<Network,_5UL> nets;
  undefined1 local_e0 [16];
  ChaCha20 local_d0;
  Network local_58 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0] = NET_IPV4;
  local_58[1] = NET_IPV6;
  local_58[2] = NET_ONION;
  local_58[3] = NET_I2P;
  local_58[4] = 5;
  FastRandomContext::FastRandomContext((FastRandomContext *)local_e0,false);
  std::shuffle<Network*,FastRandomContext>(local_58,local_58 + 5,(FastRandomContext *)local_e0);
  ChaCha20::~ChaCha20(&local_d0);
  local_e0._0_8_ = &this->m_nodes_mutex;
  local_e0[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_e0);
  bVar4 = true;
  lVar3 = 0;
  do {
    net = *(Network *)((long)local_58 + lVar3);
    bVar1 = ReachableNets::Contains(&g_reachable_nets,net);
    if ((bVar1) && ((this->m_network_conn_counts)._M_elems[net] == 0)) {
      net_00 = (_Optional_payload_base<Network>)((ulong)net | 0x100000000);
      sVar2 = AddrMan::Size(this->addrman,(optional<Network>)net_00,(optional<bool>)0x0);
      if (sVar2 != 0) {
        (network->super__Optional_base<Network,_true,_true>)._M_payload.
        super__Optional_payload_base<Network> = net_00;
        break;
      }
    }
    lVar3 = lVar3 + 4;
    bVar4 = lVar3 != 0x14;
  } while (bVar4);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::MaybePickPreferredNetwork(std::optional<Network>& network)
{
    std::array<Network, 5> nets{NET_IPV4, NET_IPV6, NET_ONION, NET_I2P, NET_CJDNS};
    std::shuffle(nets.begin(), nets.end(), FastRandomContext());

    LOCK(m_nodes_mutex);
    for (const auto net : nets) {
        if (g_reachable_nets.Contains(net) && m_network_conn_counts[net] == 0 && addrman.Size(net) != 0) {
            network = net;
            return true;
        }
    }

    return false;
}